

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepScanLineOutputFile::setFrameBuffer
          (DeepScanLineOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  PixelType PVar1;
  int iVar2;
  size_t xst;
  size_t yst;
  bool bVar3;
  ostream *poVar4;
  char *pcVar5;
  DeepFrameBuffer *this_00;
  ArgExc *pAVar6;
  Channel *pCVar7;
  OutSliceInfo *pOVar8;
  DeepSlice *pDVar9;
  size_type sVar10;
  reference ppOVar11;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  size_t i_2;
  ConstIterator j_1;
  ConstIterator i_1;
  vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
  slices;
  Slice *sampleCountSlice;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ConstIterator j;
  ConstIterator i;
  ChannelList *channels;
  lock_guard<std::mutex> lock;
  int in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  int in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  value_type in_stack_fffffffffffffa40;
  Channel *in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  PixelType in_stack_fffffffffffffad4;
  char *in_stack_fffffffffffffb30;
  DeepFrameBuffer *in_stack_fffffffffffffb38;
  ulong local_3b8;
  stringstream local_360 [16];
  ostream local_350 [376];
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  ChannelList *local_20;
  DeepFrameBuffer *local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30)
             ,(mutex_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  local_20 = Header::channels((Header *)0x1a4260);
  local_38._M_node =
       (_Base_ptr)
       ChannelList::begin((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
  do {
    local_40._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    bVar3 = Imf_3_2::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if (!bVar3) {
      this_00 = (DeepFrameBuffer *)DeepFrameBuffer::getSampleCountSlice(local_10);
      if (*(char **)&(this_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header != (char *)0x0) {
        *(char **)(*(long *)(in_RDI + 8) + 0x148) =
             *(char **)&(this_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header;
        *(int *)(*(long *)(in_RDI + 8) + 0x150) =
             (int)(this_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        *(int *)(*(long *)(in_RDI + 8) + 0x154) =
             (int)(this_00->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
        ::vector((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                  *)0x1a489c);
        ChannelList::begin((ChannelList *)
                           CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        while( true ) {
          ChannelList::end((ChannelList *)
                           CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
          bVar3 = Imf_3_2::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
          ;
          if (!bVar3) break;
          ChannelList::ConstIterator::name((ConstIterator *)0x1a4935);
          DeepFrameBuffer::find(this_00,in_stack_fffffffffffffb30);
          DeepFrameBuffer::end
                    ((DeepFrameBuffer *)
                     CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
          bVar3 = Imf_3_2::operator==((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
          ;
          if (bVar3) {
            pOVar8 = (OutSliceInfo *)operator_new(0x38);
            pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x1a49e4);
            in_stack_fffffffffffffad4 = pCVar7->type;
            pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x1a4a0c);
            in_stack_fffffffffffffa28 = pCVar7->xSampling;
            in_stack_fffffffffffffac8 =
                 ChannelList::ConstIterator::channel((ConstIterator *)0x1a4a35);
            in_stack_fffffffffffffa30 = in_stack_fffffffffffffac8->ySampling;
            anon_unknown_6::OutSliceInfo::OutSliceInfo
                      (pOVar8,in_stack_fffffffffffffad4,(char *)0x0,0,0,0,in_stack_fffffffffffffa28,
                       in_stack_fffffffffffffa30,true);
            std::
            vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
            ::push_back((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                         *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                        (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
            ;
          }
          else {
            pOVar8 = (OutSliceInfo *)operator_new(0x38);
            pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4b15);
            PVar1 = (pDVar9->super_Slice).type;
            pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4b3a);
            pcVar5 = (pDVar9->super_Slice).base;
            pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4b62);
            iVar2 = *(int *)&(pDVar9->super_Slice).field_0x34;
            pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4b84);
            xst = (pDVar9->super_Slice).xStride;
            pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4ba6);
            yst = (pDVar9->super_Slice).yStride;
            pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4bc8);
            in_stack_fffffffffffffa28 = (pDVar9->super_Slice).xSampling;
            pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4be8);
            in_stack_fffffffffffffa30 = (pDVar9->super_Slice).ySampling;
            anon_unknown_6::OutSliceInfo::OutSliceInfo
                      (pOVar8,PVar1,pcVar5,(long)iVar2,xst,yst,in_stack_fffffffffffffa28,
                       in_stack_fffffffffffffa30,false);
            std::
            vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
            ::push_back((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                         *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                        (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
            ;
          }
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30))
          ;
        }
        DeepFrameBuffer::operator=
                  ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28))
        ;
        for (local_3b8 = 0;
            sVar10 = std::
                     vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                     ::size((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                             *)(*(long *)(in_RDI + 8) + 0x108)), local_3b8 < sVar10;
            local_3b8 = local_3b8 + 1) {
          ppOVar11 = std::
                     vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                     ::operator[]((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                                   *)(*(long *)(in_RDI + 8) + 0x108),local_3b8);
          in_stack_fffffffffffffa40 = *ppOVar11;
          if (in_stack_fffffffffffffa40 != (value_type)0x0) {
            operator_delete(in_stack_fffffffffffffa40,0x38);
          }
        }
        std::
        vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
        ::operator=((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                     *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                    (vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                     *)in_stack_fffffffffffffac8);
        std::
        vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
        ::~vector((vector<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::OutSliceInfo_*>_>
                   *)in_stack_fffffffffffffa40);
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1a4d90);
        return;
      }
      pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (pAVar6,"Invalid base pointer, please set a proper sample count slice.");
      __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    ChannelList::ConstIterator::name((ConstIterator *)0x1a4313);
    local_48._M_node =
         (_Base_ptr)DeepFrameBuffer::find(in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
    local_50._M_node =
         (_Base_ptr)
         DeepFrameBuffer::end
                   ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                   );
    bVar3 = Imf_3_2::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if (!bVar3) {
      pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x1a43c9);
      PVar1 = pCVar7->type;
      pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a43f1);
      if (PVar1 != (pDVar9->super_Slice).type) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1d8);
        poVar4 = std::operator<<(local_1c8,"Pixel type of \"");
        pcVar5 = ChannelList::ConstIterator::name((ConstIterator *)0x1a4455);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of output file \"");
        pcVar5 = fileName((DeepScanLineOutputFile *)0x1a44a9);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar6,local_1d8);
        __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x1a4585);
      iVar2 = pCVar7->xSampling;
      pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a45ae);
      if (iVar2 != (pDVar9->super_Slice).xSampling) {
LAB_001a4624:
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_360);
        poVar4 = std::operator<<(local_350,"X and/or y subsampling factors of \"");
        pcVar5 = ChannelList::ConstIterator::name((ConstIterator *)0x1a4667);
        poVar4 = std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<(poVar4,"\" channel of output file \"");
        pcVar5 = fileName((DeepScanLineOutputFile *)0x1a46bb);
        poVar4 = std::operator<<(poVar4,pcVar5);
        std::operator<<(poVar4,"\" are not compatible with the frame buffer\'s subsampling factors."
                       );
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar6,local_360);
        __cxa_throw(pAVar6,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      pCVar7 = ChannelList::ConstIterator::channel((ConstIterator *)0x1a45d9);
      iVar2 = pCVar7->ySampling;
      pDVar9 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1a4602);
      if (iVar2 != (pDVar9->super_Slice).ySampling) goto LAB_001a4624;
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  } while( true );
}

Assistant:

void
DeepScanLineOutputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");
        }

        if (i.channel ().xSampling != j.slice ().xSampling ||
            i.channel ().ySampling != j.slice ().ySampling)
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << i.name ()
                    << "\" channel "
                       "of output file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
        }
    }

    //
    // Store the pixel sample count table.
    // (TODO) Support for different sampling rates?
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    // (TODO) Support for different sampling rates?
    //

    vector<OutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new OutSliceInfo (
                i.channel ().type,
                NULL, // base
                0,    // sampleStride,
                0,    // xStride
                0,    // yStride
                i.channel ().xSampling,
                i.channel ().ySampling,
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new OutSliceInfo (
                j.slice ().type,
                j.slice ().base,
                j.slice ().sampleStride,
                j.slice ().xStride,
                j.slice ().yStride,
                j.slice ().xSampling,
                j.slice ().ySampling,
                false)); // zero
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices = slices;
}